

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaCallNode *node)

{
  LambdaNode *pLVar1;
  unsigned_long __val;
  unsigned_long __val_00;
  int iVar2;
  undefined4 extraout_var;
  optional<TypeName> *poVar4;
  mapped_type *pmVar5;
  TypeName *__k;
  _Self __tmp;
  undefined8 *puVar6;
  long *plVar7;
  TypeChecker typeChecker;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  long *plVar3;
  
  pLVar1 = (node->lambda_)._M_t.super___uniq_ptr_impl<LambdaNode,_std::default_delete<LambdaNode>_>.
           _M_t.super__Tuple_impl<0UL,_LambdaNode_*,_std::default_delete<LambdaNode>_>.
           super__Head_base<0UL,_LambdaNode_*,_false>._M_head_impl;
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  __val = (pLVar1->arguments_).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
          ._M_impl._M_node._M_size;
  __val_00 = plVar3[2];
  (**(code **)(*(long *)&(pLVar1->super_ExpressionNode).super_Node + 0x10))(pLVar1,this);
  if (__val != __val_00) {
    std::__cxx11::to_string((string *)local_f0,__val);
    std::operator+(&local_d0,"Lambda expected ",(string *)local_f0);
    std::operator+(&local_b0,&local_d0,", but got ");
    std::__cxx11::to_string(&local_50,__val_00);
    std::operator+(&local_90,&local_b0,&local_50);
    std::operator+(&local_70,&local_90," arguments!");
    reportError(&local_70,(Node *)node);
  }
  puVar6 = *(undefined8 **)
            &(pLVar1->arguments_).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             ._M_impl;
  plVar7 = plVar3;
  do {
    plVar7 = (long *)*plVar7;
    if (plVar7 == plVar3) {
      return;
    }
    (**(code **)(*(long *)plVar7[2] + 0x10))((long *)plVar7[2],this);
    local_f0._0_8_ = &PTR__Visitor_00148e98;
    local_f0[0xc] = false;
    local_e0._M_allocated_capacity = (size_type)&this->symbols_;
    (**(code **)(*(long *)plVar7[2] + 0x10))((long *)plVar7[2],(TypeChecker *)local_f0);
    poVar4 = TypeChecker::getType((TypeChecker *)local_f0);
    if ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
        super__Optional_payload_base<TypeName>._M_engaged == true) {
      poVar4 = TypeChecker::getType((TypeChecker *)local_f0);
      if (((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
           super__Optional_payload_base<TypeName>._M_engaged != true) ||
         ((poVar4->super__Optional_base<TypeName,_true,_true>)._M_payload.
          super__Optional_payload_base<TypeName>._M_payload._M_value != *(TypeName *)(puVar6 + 6)))
      {
        pmVar5 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,(key_type *)(puVar6 + 6));
        std::operator+(&local_d0,"Lambda expected argument of type ",pmVar5);
        std::operator+(&local_b0,&local_d0,", but got ");
        poVar4 = TypeChecker::getType((TypeChecker *)local_f0);
        __k = std::optional<TypeName>::value(poVar4);
        pmVar5 = std::__detail::
                 _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&TypeNameStrings_abi_cxx11_,__k);
        std::operator+(&local_90,&local_b0,pmVar5);
        std::operator+(&local_70,&local_90,"!");
        reportError(&local_70,(Node *)node);
      }
    }
    puVar6 = (undefined8 *)*puVar6;
  } while( true );
}

Assistant:

void SemanticAnalyser::visit(const LambdaCallNode& node) 
{
  const auto& lambda = node.getLambda();
  const auto& expectedArguments = lambda.getArguments();
  const auto& providedArguments = node.getArguments();
  const auto nExpectedArgs = expectedArguments.size();
  const auto nProvidedArgs = providedArguments.size();

  lambda.accept(*this);

  if(nExpectedArgs != nProvidedArgs)
    reportError("Lambda expected " + std::to_string(nExpectedArgs) + 
      ", but got " + std::to_string(nProvidedArgs) + " arguments!", node);


  auto expectedArgumentIt = expectedArguments.begin();
  for(const auto& arg : providedArguments)
  {
    arg->accept(*this);

    TypeChecker typeChecker{symbols_};
    arg->accept(typeChecker);
    if(typeChecker.getType().has_value() && typeChecker.getType() != expectedArgumentIt->second)
      reportError("Lambda expected argument of type " + 
        TypeNameStrings.at(expectedArgumentIt->second) + ", but got " + 
          TypeNameStrings.at(typeChecker.getType().value()) + "!", node);

    expectedArgumentIt++;
  }
}